

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  bool bVar1;
  Status SVar2;
  unsigned_long uVar3;
  char *pcVar4;
  uint uVar5;
  ulong dindex;
  bool bVar6;
  string_view prefix;
  string_view str;
  Directory d;
  string path;
  string ppath;
  string sfname;
  string fname;
  allocator<char> local_ca;
  allocator<char> local_c9;
  Directory local_c8;
  int local_bc;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_bc = type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(files);
  if ((glob->_M_dataplus)._M_p[glob->_M_string_length - 1] == '*') {
    cmsys::SystemTools::GetFilenamePath(&local_b8,glob);
    cmsys::SystemTools::GetFilenameName(&local_90,glob);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_b8._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_b8);
    }
    cmsys::Directory::Directory(&local_c8);
    SVar2 = cmsys::Directory::Load(&local_c8,&local_b8,(string *)0x0);
    uVar5 = 0;
    bVar6 = false;
    if (SVar2.Kind_ == Success) {
      bVar6 = false;
      local_98 = files;
      while( true ) {
        uVar3 = cmsys::Directory::GetNumberOfFiles(&local_c8);
        dindex = (ulong)uVar5;
        if (uVar3 <= dindex) break;
        pcVar4 = cmsys::Directory::GetFile(&local_c8,dindex);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_ca);
        bVar1 = std::operator!=(&local_50,".");
        if (bVar1) {
          pcVar4 = cmsys::Directory::GetFile(&local_c8,dindex);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_c9);
          bVar1 = std::operator!=(&local_70,"..");
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_50,(string *)&local_b8);
            if (local_b8._M_dataplus._M_p[local_b8._M_string_length - 1] != '/') {
              std::__cxx11::string::append((char *)&local_50);
            }
            cmsys::Directory::GetFile(&local_c8,dindex);
            std::__cxx11::string::append((char *)&local_50);
            pcVar4 = cmsys::Directory::GetFile(&local_c8,dindex);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_ca)
            ;
            if (local_bc < 1) {
              if ((-1 < local_bc) || (bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50), bVar1)
                 ) goto LAB_0028477d;
            }
            else {
              bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50);
              if (!bVar1) {
LAB_0028477d:
                prefix._M_str = local_90._M_dataplus._M_p;
                prefix._M_len = local_90._M_string_length;
                str._M_str = local_70._M_dataplus._M_p;
                str._M_len = local_70._M_string_length;
                bVar1 = cmHasPrefix(str,prefix);
                if (bVar1) {
                  bVar6 = true;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_98,&local_50);
                }
              }
            }
            std::__cxx11::string::~string((string *)&local_70);
            goto LAB_002847b2;
          }
        }
        else {
LAB_002847b2:
          std::__cxx11::string::~string((string *)&local_50);
        }
        uVar5 = uVar5 + 1;
      }
    }
    cmsys::Directory::~Directory(&local_c8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if (glob.back() != '*') {
    return false;
  }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size() - 1);
  if (path.empty()) {
    path = "/";
  }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = path;
        if (path.back() != '/') {
          fname += "/";
        }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if (type > 0 && cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (type < 0 && !cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (cmHasPrefix(sfname, ppath)) {
          files.push_back(fname);
          res = true;
        }
      }
    }
  }
  return res;
}